

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ogt_vox_scene *scene_00;
  double dVar3;
  bool local_ea;
  allocator local_e9;
  string local_e8 [5];
  bool output_file_per_frame;
  bool ret;
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  string local_70 [8];
  string output_prefix;
  ogt_vox_scene *scene;
  uint32_t read_scene_flags;
  int i;
  float scale;
  uint32_t frame_max;
  uint32_t frame_min;
  bool output_as_vox;
  bool all_frames_in_one;
  char *output_name;
  char *mesh_algorithm;
  char *input_file;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    print_help();
    printf("\n\nPress enter to continue!");
    std::istream::get();
    return 0;
  }
  mesh_algorithm = (char *)0x0;
  output_name = "polygon";
  _frame_min = (char *)0x0;
  frame_max._3_1_ = 0;
  bVar1 = false;
  scale = -NAN;
  i = -1;
  read_scene_flags = 0x3f800000;
  scene._4_4_ = 1;
  while (scene._4_4_ < argc) {
    iVar2 = strcmp(argv[scene._4_4_],"--mesh_algorithm");
    if (iVar2 == 0) {
      output_name = argv[scene._4_4_ + 1];
      scene._4_4_ = scene._4_4_ + 2;
    }
    else {
      iVar2 = strcmp(argv[scene._4_4_],"--all_frames_in_one");
      if (iVar2 == 0) {
        frame_max._3_1_ = 1;
        scene._4_4_ = scene._4_4_ + 1;
      }
      else {
        iVar2 = strcmp(argv[scene._4_4_],"--frames");
        if (iVar2 == 0) {
          scale = (float)atoi(argv[scene._4_4_ + 1]);
          i = atoi(argv[scene._4_4_ + 2]);
          scene._4_4_ = scene._4_4_ + 3;
        }
        else {
          iVar2 = strcmp(argv[scene._4_4_],"--output_name");
          if (iVar2 == 0) {
            _frame_min = argv[scene._4_4_ + 1];
            scene._4_4_ = scene._4_4_ + 2;
          }
          else {
            iVar2 = strcmp(argv[scene._4_4_],"--scale");
            if (iVar2 == 0) {
              dVar3 = atof(argv[scene._4_4_ + 1]);
              read_scene_flags = (uint32_t)(float)dVar3;
              scene._4_4_ = scene._4_4_ + 2;
            }
            else {
              iVar2 = strcmp(argv[scene._4_4_],"--output_vox");
              if (iVar2 != 0) {
                iVar2 = strncmp(argv[scene._4_4_],"--",2);
                if (iVar2 == 0) {
                  printf("ERROR: unrecognized parameter \'%s\'\n",argv[scene._4_4_]);
                  return 1;
                }
                mesh_algorithm = argv[scene._4_4_];
                break;
              }
              bVar1 = true;
              scene._4_4_ = scene._4_4_ + 1;
            }
          }
        }
      }
    }
  }
  if (mesh_algorithm == (char *)0x0) {
    printf("ERROR: expected last argument to be input file\n");
    print_help();
    return 1;
  }
  scene_00 = load_vox_scene(mesh_algorithm,0xf);
  if (scene_00 == (ogt_vox_scene *)0x0) {
    printf("ERROR: could not load input file: %s",mesh_algorithm);
    return 3;
  }
  std::__cxx11::string::string(local_70);
  if (_frame_min == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,mesh_algorithm,&local_91);
    std::__cxx11::string::operator=(local_70,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::find_first_of((char)local_70,0x2e);
    std::__cxx11::string::substr((ulong)local_c8,(ulong)local_70);
    std::__cxx11::string::operator=(local_70,local_c8);
    std::__cxx11::string::~string(local_c8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,_frame_min,&local_e9);
    std::__cxx11::string::operator=(local_70,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if (bVar1) {
    local_ea = export_scene_anim_as_vox(scene_00,(string *)local_70,(uint32_t)scale,i);
  }
  else {
    iVar2 = strcmp(output_name,"polygon");
    if (((iVar2 != 0) && (iVar2 = strcmp(output_name,"greedy"), iVar2 != 0)) &&
       (iVar2 = strcmp(output_name,"simple"), iVar2 != 0)) {
      printf("ERROR: invalid mesh algorithm specified: %s",output_name);
      print_help();
      argv_local._4_4_ = 2;
      goto LAB_00119a56;
    }
    local_ea = export_scene_anim_as_obj
                         (scene_00,(string *)local_70,(bool)((frame_max._3_1_ ^ 0xff) & 1),
                          (float)read_scene_flags,(uint32_t)scale,i,output_name);
  }
  ogt_vox_destroy_scene(scene_00);
  argv_local._4_4_ = 0;
  if (local_ea != false) {
    argv_local._4_4_ = 4;
  }
LAB_00119a56:
  std::__cxx11::string::~string(local_70);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
    // print help if no args are provided
    if (argc == 1) {
        print_help();
        // wait for keyboard input
        printf("\n\nPress enter to continue!");
        std::cin.get();

        return 0;
    }

    // default parameter values
    const char* input_file        = nullptr;
    const char* mesh_algorithm    = "polygon";
    const char* output_name       = nullptr;
    bool        all_frames_in_one = false;
    bool        output_as_vox     = false;
    uint32_t    frame_min         = UINT32_MAX; // auto!
    uint32_t    frame_max         = UINT32_MAX; // auto!
    float       scale             = 1.0f;

    // parse arguments and override default parameter values
    for (int i = 1; i < argc; ) {
        if (strcmp(argv[i], "--mesh_algorithm")==0) {
            mesh_algorithm = argv[i+1];
            i += 2;
        }
        else if (strcmp(argv[i], "--all_frames_in_one") == 0) {
            all_frames_in_one = true;
            i++;
        }
        else if (strcmp(argv[i], "--frames") == 0) {
            frame_min = atoi(argv[i+1]);
            frame_max = atoi(argv[i+2]);
            i += 3;
        }
        else if (strcmp(argv[i], "--output_name") == 0) {
            output_name = argv[i+1];
            i += 2;
        }
        else if (strcmp(argv[i], "--scale") == 0) {
            scale = (float)atof(argv[i+1]);
            i += 2;
        }
        else if (strcmp(argv[i], "--output_vox") == 0) {
            output_as_vox = true;
            i++;
        }
        else if (strncmp(argv[i], "--", 2) == 0) {
            printf("ERROR: unrecognized parameter '%s'\n", argv[i]);
            return 1;
        }
        else {
            input_file = argv[i];
            break;
        }
    }

    // validate that an input file was specified.
    if (!input_file) {
        printf("ERROR: expected last argument to be input file\n");
        print_help();
        return 1;
    }

    uint32_t read_scene_flags = k_read_scene_flags_keyframes | k_read_scene_flags_groups | k_read_scene_flags_keep_empty_models_instances | k_read_scene_flags_keep_duplicate_models;

    const ogt_vox_scene* scene = load_vox_scene(input_file, read_scene_flags);
    if (!scene) {
        printf("ERROR: could not load input file: %s", input_file);
        return 3;
    }

    // either use the output prefix specified, or generate one from the input filename.
    std::string output_prefix;
    if (!output_name) {
        output_prefix = std::string(input_file);
        output_prefix = output_prefix.substr(0, output_prefix.find_first_of('.'));
    }
    else {
        output_prefix = std::string(output_name);
    }

    bool ret = false;
    if (output_as_vox) {
        ret = export_scene_anim_as_vox(scene, output_prefix, frame_min, frame_max);
    }
    else {
        bool output_file_per_frame = !all_frames_in_one;
        // validate specified mesh_algorithm is one of "polygon", "greedy" or "simple"
        if (strcmp(mesh_algorithm, "polygon") != 0 &&
            strcmp(mesh_algorithm, "greedy") != 0 &&
            strcmp(mesh_algorithm, "simple") != 0)
        {
            printf("ERROR: invalid mesh algorithm specified: %s", mesh_algorithm);
            print_help();
            return 2;
        }
        ret = export_scene_anim_as_obj(scene, output_prefix, output_file_per_frame, scale, frame_min, frame_max, mesh_algorithm);
    }
    ogt_vox_destroy_scene(scene);

    return ret ? 4 : 0;
}